

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.hpp
# Opt level: O0

void __thiscall
glu::decl::DeclareStructType::DeclareStructType
          (DeclareStructType *this,StructType *structType_,int indentLevel_)

{
  int indentLevel__local;
  StructType *structType__local;
  DeclareStructType *this_local;
  
  StructType::StructType(&this->structType,structType_);
  this->indentLevel = indentLevel_;
  return;
}

Assistant:

DeclareStructType (const StructType& structType_, int indentLevel_) : structType(structType_), indentLevel(indentLevel_) {}